

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::AggressiveDCEPass::GetHeaderBlock(AggressiveDCEPass *this,BasicBlock *blk)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  StructuredCFGAnalysis *this_00;
  AggressiveDCEPass *pAStack_28;
  uint32_t header;
  BasicBlock *header_block;
  BasicBlock *blk_local;
  AggressiveDCEPass *this_local;
  
  if (blk == (BasicBlock *)0x0) {
    this_local = (AggressiveDCEPass *)0x0;
  }
  else {
    bVar1 = BasicBlock::IsLoopHeader(blk);
    pAStack_28 = (AggressiveDCEPass *)blk;
    if (!bVar1) {
      pIVar3 = Pass::context((Pass *)this);
      this_00 = IRContext::GetStructuredCFGAnalysis(pIVar3);
      uVar2 = BasicBlock::id(blk);
      uVar2 = StructuredCFGAnalysis::ContainingConstruct(this_00,uVar2);
      pIVar3 = Pass::context((Pass *)this);
      pAStack_28 = (AggressiveDCEPass *)IRContext::get_instr_block(pIVar3,uVar2);
    }
    this_local = pAStack_28;
  }
  return (BasicBlock *)this_local;
}

Assistant:

BasicBlock* AggressiveDCEPass::GetHeaderBlock(BasicBlock* blk) const {
  if (blk == nullptr) {
    return nullptr;
  }

  BasicBlock* header_block = nullptr;
  if (blk->IsLoopHeader()) {
    header_block = blk;
  } else {
    uint32_t header =
        context()->GetStructuredCFGAnalysis()->ContainingConstruct(blk->id());
    header_block = context()->get_instr_block(header);
  }
  return header_block;
}